

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O2

err_t brngHMACRand(void *buf,size_t count,octet *key,size_t key_len,octet *iv,size_t iv_len)

{
  bool_t bVar1;
  size_t size;
  blob_t state;
  err_t eVar2;
  
  bVar1 = memIsValid(key,key_len);
  eVar2 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = memIsValid(iv,iv_len);
    if (bVar1 != 0) {
      bVar1 = memIsValid(buf,count);
      if (bVar1 != 0) {
        bVar1 = memIsDisjoint2(buf,count,iv,iv_len);
        if (bVar1 != 0) {
          size = brngHMAC_keep();
          state = blobCreate(size);
          if (state == (blob_t)0x0) {
            eVar2 = 0x6e;
          }
          else {
            brngHMACStart(state,key,key_len,iv,iv_len);
            brngHMACStepR(buf,count,state);
            blobClose(state);
            eVar2 = 0;
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t brngHMACRand(void* buf, size_t count, const octet key[], size_t key_len,
	const octet iv[], size_t iv_len)
{
	void* state;
	// проверить входные данные
	if (!memIsValid(key, key_len) ||
		!memIsValid(iv, iv_len) ||
		!memIsValid(buf, count) ||
		!memIsDisjoint2(buf, count, iv, iv_len))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(brngHMAC_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// сгенерировать данные
	brngHMACStart(state, key, key_len, iv, iv_len);
	brngHMACStepR(buf, count, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}